

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::ExportStatsByIp(DnsStats *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_48;
  uint local_44;
  uint32_t i;
  uint32_t not_sending_recursive_count;
  uint32_t sending_recursive_count;
  uint32_t issued_syn_443;
  uint32_t issued_syn_583;
  uint32_t total_queries;
  uint32_t not_minimizing_count;
  uint32_t qname_minimizing_count;
  uint32_t not_using_edns_count;
  uint32_t using_edns_count;
  uint32_t not_using_do_count;
  uint32_t using_do_count;
  StatsByIP *sbi;
  DnsStats *this_local;
  
  using_edns_count = 0;
  not_using_edns_count = 0;
  qname_minimizing_count = 0;
  not_minimizing_count = 0;
  total_queries = 0;
  issued_syn_583 = 0;
  issued_syn_443 = 0;
  sending_recursive_count = 0;
  not_sending_recursive_count = 0;
  i = 0;
  local_44 = 0;
  for (local_48 = 0; uVar2 = BinHash<StatsByIP>::GetSize(&this->statsByIp), local_48 < uVar2;
      local_48 = local_48 + 1) {
    for (_not_using_do_count = BinHash<StatsByIP>::GetEntry(&this->statsByIp,local_48);
        _not_using_do_count != (StatsByIP *)0x0; _not_using_do_count = _not_using_do_count->HashNext
        ) {
      if ((_not_using_do_count->query_seen & 1U) != 0) {
        issued_syn_443 = issued_syn_443 + 1;
      }
      if ((_not_using_do_count->response_seen & 1U) != 0) {
        bVar1 = StatsByIP::IsDoUsed(_not_using_do_count);
        if (bVar1) {
          using_edns_count = using_edns_count + 1;
        }
        else {
          not_using_edns_count = not_using_edns_count + 1;
        }
        bVar1 = StatsByIP::IsEdnsSupported(_not_using_do_count);
        if (bVar1) {
          qname_minimizing_count = qname_minimizing_count + 1;
        }
        else {
          not_minimizing_count = not_minimizing_count + 1;
        }
        bVar1 = StatsByIP::IsQnameMinimized(_not_using_do_count);
        if (bVar1) {
          total_queries = total_queries + 1;
        }
        else {
          issued_syn_583 = issued_syn_583 + 1;
        }
        if (_not_using_do_count->nb_recursive_queries == 0) {
          local_44 = local_44 + 1;
        }
        else {
          i = i + 1;
        }
      }
      if (_not_using_do_count->nb_tcp_443 != 0) {
        not_sending_recursive_count = not_sending_recursive_count + 1;
      }
      if (_not_using_do_count->nb_tcp_583 != 0) {
        sending_recursive_count = sending_recursive_count + 1;
      }
    }
  }
  SubmitRegistryNumberAndCount(this,0x29,0,(ulong)not_using_edns_count);
  SubmitRegistryNumberAndCount(this,0x29,1,(ulong)using_edns_count);
  SubmitRegistryNumberAndCount(this,0x2b,0,(ulong)not_minimizing_count);
  SubmitRegistryNumberAndCount(this,0x2b,1,(ulong)qname_minimizing_count);
  SubmitRegistryNumberAndCount(this,0x2c,0,(ulong)issued_syn_583);
  SubmitRegistryNumberAndCount(this,0x2c,1,(ulong)total_queries);
  SubmitRegistryNumberAndCount(this,0x41,0,(ulong)local_44);
  SubmitRegistryNumberAndCount(this,0x41,1,(ulong)i);
  SubmitRegistryNumberAndCount(this,0x2e,0,(ulong)issued_syn_443);
  if ((this->is_capture_dns_only & 1U) == 0) {
    uVar2 = BinHash<StatsByIP>::GetSize(&this->statsByIp);
    SubmitRegistryNumberAndCount(this,0x30,0,(ulong)uVar2);
    SubmitRegistryNumberAndCount(this,0x30,0x247,(ulong)sending_recursive_count);
    SubmitRegistryNumberAndCount(this,0x30,0x1bb,(ulong)not_sending_recursive_count);
  }
  BinHash<StatsByIP>::Clear(&this->statsByIp);
  return;
}

Assistant:

void DnsStats::ExportStatsByIp()
{
    StatsByIP *sbi;
    uint32_t using_do_count = 0;
    uint32_t not_using_do_count = 0;
    uint32_t using_edns_count = 0;
    uint32_t not_using_edns_count = 0;
    uint32_t qname_minimizing_count = 0;
    uint32_t not_minimizing_count = 0;
    uint32_t total_queries = 0;
    uint32_t issued_syn_583 = 0;
    uint32_t issued_syn_443 = 0;
    uint32_t sending_recursive_count = 0;
    uint32_t not_sending_recursive_count = 0;

    for (uint32_t i = 0; i < statsByIp.GetSize(); i++)
    {
        sbi = statsByIp.GetEntry(i);

        while (sbi != NULL)
        {
            if (sbi->query_seen) {
                total_queries++;
            }

            if (sbi->response_seen) {
                if (sbi->IsDoUsed()) {
                    using_do_count++;
                }
                else {
                    not_using_do_count++;
                }

                if (sbi->IsEdnsSupported()) {
                    using_edns_count++;
                }
                else {
                    not_using_edns_count++;
                }

                if (sbi->IsQnameMinimized()) {
                    qname_minimizing_count++;
                }
                else {
                    not_minimizing_count++;
                }

                if (sbi->nb_recursive_queries > 0) {
                    sending_recursive_count++;
                }
                else {
                    not_sending_recursive_count++;
                }
            }

            if (sbi->nb_tcp_443 > 0) {
                issued_syn_443++;
            }

            if (sbi->nb_tcp_583 > 0) {
                issued_syn_583++;
            }

            sbi = sbi->HashNext;
        }
    }

    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 0, not_using_do_count);
    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 1, using_do_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 0, not_using_edns_count);
    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 1, using_edns_count);

    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 0, not_minimizing_count);
    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 1, qname_minimizing_count);

    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 0, not_sending_recursive_count);
    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 1, sending_recursive_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_OPT_USAGE_REF, 0, total_queries);

    if (!is_capture_dns_only) {
        /* Only add these counts if using PCAP directly, not DNSCAP */
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 0, statsByIp.GetSize());
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 583, issued_syn_583);
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 443, issued_syn_443);
    }

    statsByIp.Clear();
}